

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

bool __thiscall lzham::vector<unsigned_char>::try_push_back(vector<unsigned_char> *this,uchar *obj)

{
  bool bVar1;
  uchar *in_RSI;
  vector<unsigned_char> *in_RDI;
  bool in_stack_ffffffffffffffda;
  bool in_stack_ffffffffffffffdb;
  uint in_stack_ffffffffffffffdc;
  bool local_1;
  
  if ((in_RDI->m_size < in_RDI->m_capacity) ||
     (bVar1 = increase_capacity(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffdb,
                                in_stack_ffffffffffffffda), bVar1)) {
    scalar_type<unsigned_char>::construct(in_RDI->m_p + in_RDI->m_size,in_RSI);
    in_RDI->m_size = in_RDI->m_size + 1;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool try_push_back(const T& obj)
      {
         LZHAM_ASSERT(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
         {
            if (!increase_capacity(m_size + 1, true, true))
            {
               LZHAM_LOG_ERROR(5007);
               return false;
            }
         }

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;

         return true;
      }